

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveStrategy::continueAlgo(SolveStrategy *this)

{
  bool bVar1;
  __int_type _Var2;
  __sighandler_t p_Var3;
  __sighandler_t in_RDX;
  int in_ESI;
  SolveStrategy *in_RDI;
  bool detach;
  int in_stack_00000074;
  int in_stack_00000078;
  bool in_stack_0000007f;
  SolveStrategy *in_stack_00000080;
  byte local_2a;
  byte local_29;
  SolveAlgorithm *in_stack_ffffffffffffffe8;
  
  p_Var3 = signal(in_RDI,in_ESI,in_RDX);
  if ((int)p_Var3 != 0) {
    bVar1 = running((SolveStrategy *)0x1314ac);
    local_29 = 1;
    if (bVar1) goto LAB_001314fa;
  }
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base<unsigned_int> *)in_RDI);
  local_2a = 0;
  if (_Var2 == 1) {
    bVar1 = SolveAlgorithm::next(in_stack_ffffffffffffffe8);
    local_2a = bVar1 ^ 0xff;
  }
  local_29 = local_2a;
LAB_001314fa:
  if ((local_29 & 1) != 0) {
    SolveAlgorithm::more(in_RDI->algo_);
    detachAlgo(in_stack_00000080,in_stack_0000007f,in_stack_00000078,in_stack_00000074);
  }
  return;
}

Assistant:

void continueAlgo() {
		bool detach = true;
		try {
			detach = (signal() && running()) || (state_ == state_run && !algo_->next());
			if (detach) { detach = false; detachAlgo(algo_->more(), 0); }
		}
		catch (...) {
			if (detach) { detachAlgo(algo_->more(), 1); }
			else        { throw; }
		}
	}